

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void convergeephemerons(global_State *g)

{
  Table *pTVar1;
  int iVar2;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  bool bVar3;
  Table *h;
  
  do {
    h = (Table *)g->ephemeron;
    g->ephemeron = (GCObject *)0x0;
    bVar3 = true;
    while (h != (Table *)0x0) {
      if (h->tt != '\x05') {
        __assert_fail("(w)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x311,"void convergeephemerons(global_State *)");
      }
      if ((h->marked & 0x18) != 0) {
        __assert_fail("!(((h)->marked) & (((1<<(3)) | (1<<(4)))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x313,"void convergeephemerons(global_State *)");
      }
      pTVar1 = (Table *)h->gclist;
      h->marked = h->marked | 0x20;
      iVar2 = traverseephemeron(g,h,(int)in_RDX);
      in_RDX = extraout_RDX;
      h = pTVar1;
      if (iVar2 != 0) {
        propagateall(g);
        bVar3 = false;
        in_RDX = extraout_RDX_00;
      }
    }
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

static void convergeephemerons (global_State *g) {
  int changed;
  int dir = 0;
  do {
    GCObject *w;
    GCObject *next = g->ephemeron;  /* get ephemeron list */
    g->ephemeron = NULL;  /* tables may return to this list when traversed */
    changed = 0;
    while ((w = next) != NULL) {  /* for each ephemeron table */
      Table *h = gco2t(w);
      next = h->gclist;  /* list is rebuilt during loop */
      nw2black(h);  /* out of the list (for now) */
      if (traverseephemeron(g, h, dir)) {  /* marked some value? */
        propagateall(g);  /* propagate changes */
        changed = 1;  /* will have to revisit all ephemeron tables */
      }
    }
    dir = !dir;  /* invert direction next time */
  } while (changed);  /* repeat until no more changes */
}